

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini_miner.cpp
# Opt level: O1

void __thiscall
node::MiniMiner::DeleteAncestorPackage
          (MiniMiner *this,
          set<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_node::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
          *ancestors)

{
  _Rb_tree_header *p_Var1;
  long *plVar2;
  _Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_> *__src;
  pointer *pp_Var3;
  long lVar4;
  long lVar5;
  _Base_ptr p_Var6;
  long lVar7;
  long lVar8;
  _Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_> *p_Var9;
  iterator iVar10;
  _Base_ptr p_Var11;
  __normal_iterator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_*,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>
  __dest;
  _Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_> *descendant;
  _Base_ptr p_Var12;
  set<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_node::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
  *__range1;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_uint256,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_uint256,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>_>_>
  pVar13;
  
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  p_Var11 = (ancestors->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(ancestors->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var11 != p_Var1) {
    do {
      std::
      _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
      ::find(&(this->m_in_block)._M_t,(key_type *)(*(long *)(p_Var11 + 1) + 0x20));
      std::
      _Rb_tree<uint256,uint256,std::_Identity<uint256>,std::less<uint256>,std::allocator<uint256>>::
      _M_insert_unique<uint256_const&>
                ((_Rb_tree<uint256,uint256,std::_Identity<uint256>,std::less<uint256>,std::allocator<uint256>>
                  *)&this->m_in_block,(uint256 *)(*(long *)(p_Var11 + 1) + 0x20));
      lVar5 = *(long *)(p_Var11 + 1);
      this->m_total_fees = this->m_total_fees + *(long *)(lVar5 + 0x60);
      this->m_total_vsize = this->m_total_vsize + *(int *)(lVar5 + 0x50);
      iVar10 = std::
               _Rb_tree<uint256,_std::pair<const_uint256,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>,_std::_Select1st<std::pair<const_uint256,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>_>_>
               ::find(&(this->m_descendant_set_by_txid)._M_t,(key_type *)(lVar5 + 0x20));
      p_Var12 = *(_Base_ptr *)(iVar10._M_node + 2);
      p_Var6 = iVar10._M_node[2]._M_parent;
      if (p_Var12 != p_Var6) {
        lVar5 = *(long *)(*(long *)(p_Var11 + 1) + 0x50);
        lVar7 = *(long *)(*(long *)(p_Var11 + 1) + 0x60);
        do {
          lVar8 = *(long *)p_Var12;
          plVar2 = (long *)(lVar8 + 0x58);
          *plVar2 = *plVar2 - lVar5;
          plVar2 = (long *)(lVar8 + 0x68);
          *plVar2 = *plVar2 - lVar7;
          p_Var12 = (_Base_ptr)&p_Var12->_M_parent;
        } while (p_Var12 != p_Var6);
      }
      p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
    } while ((_Rb_tree_header *)p_Var11 != p_Var1);
  }
  p_Var11 = (ancestors->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)p_Var11 != p_Var1) {
    do {
      pVar13 = std::
               _Rb_tree<uint256,_std::pair<const_uint256,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>,_std::_Select1st<std::pair<const_uint256,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>_>_>
               ::equal_range(&(this->m_descendant_set_by_txid)._M_t,
                             (key_type *)(*(long *)(p_Var11 + 1) + 0x20));
      std::
      _Rb_tree<uint256,_std::pair<const_uint256,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>,_std::_Select1st<std::pair<const_uint256,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>_>_>
      ::_M_erase_aux(&(this->m_descendant_set_by_txid)._M_t,(_Base_ptr)pVar13.first._M_node,
                     (_Base_ptr)pVar13.second._M_node);
      __dest = std::
               __find_if<__gnu_cxx::__normal_iterator<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>*,std::vector<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>,std::allocator<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>const>>
                         ((this->m_entries).
                          super__Vector_base<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (this->m_entries).
                          super__Vector_base<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish,p_Var11 + 1);
      p_Var9 = (this->m_entries).
               super__Vector_base<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      __src = __dest._M_current + 1;
      if (__src != p_Var9) {
        memmove(__dest._M_current,__src,(long)p_Var9 - (long)__src);
      }
      pp_Var3 = &(this->m_entries).
                 super__Vector_base<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *pp_Var3 = *pp_Var3 + -1;
      std::
      _Rb_tree<uint256,std::pair<uint256_const,node::MiniMinerMempoolEntry>,std::_Select1st<std::pair<uint256_const,node::MiniMinerMempoolEntry>>,std::less<uint256>,std::allocator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>>
      ::erase_abi_cxx11_((_Rb_tree<uint256,std::pair<uint256_const,node::MiniMinerMempoolEntry>,std::_Select1st<std::pair<uint256_const,node::MiniMinerMempoolEntry>>,std::less<uint256>,std::allocator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>>
                          *)&this->m_entries_by_txid,*(_Base_ptr *)(p_Var11 + 1));
      p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
    } while ((_Rb_tree_header *)p_Var11 != p_Var1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void MiniMiner::DeleteAncestorPackage(const std::set<MockEntryMap::iterator, IteratorComparator>& ancestors)
{
    Assume(ancestors.size() >= 1);
    // "Mine" all transactions in this ancestor set.
    for (auto& anc : ancestors) {
        Assume(m_in_block.count(anc->first) == 0);
        m_in_block.insert(anc->first);
        m_total_fees += anc->second.GetModifiedFee();
        m_total_vsize += anc->second.GetTxSize();
        auto it = m_descendant_set_by_txid.find(anc->first);
        // Each entry’s descendant set includes itself
        Assume(it != m_descendant_set_by_txid.end());
        for (auto& descendant : it->second) {
            // If these fail, we must be double-deducting.
            Assume(descendant->second.GetModFeesWithAncestors() >= anc->second.GetModifiedFee());
            Assume(descendant->second.GetSizeWithAncestors() >= anc->second.GetTxSize());
            descendant->second.UpdateAncestorState(-anc->second.GetTxSize(), -anc->second.GetModifiedFee());
        }
    }
    // Delete these entries.
    for (const auto& anc : ancestors) {
        m_descendant_set_by_txid.erase(anc->first);
        // The above loop should have deducted each ancestor's size and fees from each of their
        // respective descendants exactly once.
        Assume(anc->second.GetModFeesWithAncestors() == 0);
        Assume(anc->second.GetSizeWithAncestors() == 0);
        auto vec_it = std::find(m_entries.begin(), m_entries.end(), anc);
        Assume(vec_it != m_entries.end());
        m_entries.erase(vec_it);
        m_entries_by_txid.erase(anc);
    }
}